

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

bool isWeightParamOfType(WeightParams *weight,WeightParamType *type)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  WeightParamType WVar6;
  uint uVar7;
  
  iVar1 = (weight->floatvalue_).current_size_;
  sVar2 = ((weight->float16value_).ptr_)->_M_string_length;
  uVar7 = (0 < iVar1) + 1;
  if (sVar2 == 0) {
    uVar7 = (uint)(0 < iVar1);
  }
  sVar3 = ((weight->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((weight->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar7 = (uVar7 - (sVar3 == 0)) + 2;
  WVar6 = UNSPECIFIED;
  if (uVar7 - uVar5 < 2) {
    WVar6 = EMPTY;
    if (uVar7 != uVar5) {
      WVar6 = (uint)(iVar1 < 1);
    }
    if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar7 != uVar5)) &&
        (((sVar3 == 0 ||
          (weight == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (WVar6 = QUINT, weight->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 ||
         (weight == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (WVar6 = QINT, weight->quantization_ == (QuantizationParams *)0x0)))) {
      WVar6 = EMPTY;
    }
  }
  return WVar6 == *type;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}